

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O2

int Gia_ObjComputeEdgeDelay
              (Gia_Man_t *p,int iObj,Vec_Int_t *vDelay,Vec_Int_t *vEdge1,Vec_Int_t *vEdge2,
              int fUseTwo)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  int Entry;
  long lVar10;
  int local_58;
  int local_54;
  
  Vec_IntWriteEntry(vEdge1,iObj,0);
  Vec_IntWriteEntry(vEdge2,iObj,0);
  if ((p->vMapping == (Vec_Int_t *)0x0) || (iVar1 = Gia_ObjIsLut(p,iObj), iVar1 == 0)) {
    iVar1 = Gia_ObjIsLut2(p,iObj);
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                    ,0x163,
                    "int Gia_ObjComputeEdgeDelay(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    iVar1 = Gia_ObjLutSize2(p,iObj);
    if (4 < iVar1) {
      __assert_fail("Gia_ObjLutSize2(p, iObj) <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                    ,0x14d,
                    "int Gia_ObjComputeEdgeDelay(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    iVar1 = -1;
    Entry = 0;
    local_54 = 0;
    local_58 = -1;
    iVar8 = 0;
    for (iVar2 = 0; iVar3 = Gia_ObjLutSize2(p,iObj), iVar2 < iVar3; iVar2 = iVar2 + 1) {
      iVar3 = Gia_ObjLutFanin2(p,iObj,iVar2);
      iVar4 = Vec_IntEntry(vDelay,iVar3);
      iVar4 = iVar4 + 10;
      if (Entry < iVar4) {
        local_54 = 1;
        iVar9 = Entry;
        Entry = iVar4;
        local_58 = iVar3;
      }
      else if (Entry == iVar4) {
        local_54 = local_54 + 1;
        iVar9 = iVar8;
        iVar1 = iVar3;
        if (fUseTwo == 0) {
          iVar9 = Entry;
        }
      }
      else {
        iVar9 = iVar4;
        if (iVar4 < iVar8) {
          iVar9 = iVar8;
        }
      }
      iVar8 = iVar9;
    }
  }
  else {
    iVar1 = Gia_ObjLutSize(p,iObj);
    if (4 < iVar1) {
      __assert_fail("Gia_ObjLutSize(p, iObj) <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                    ,0x135,
                    "int Gia_ObjComputeEdgeDelay(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    iVar1 = -1;
    local_54 = 0;
    local_58 = -1;
    Entry = 0;
    iVar8 = 0;
    for (lVar10 = 0; iVar2 = Gia_ObjLutSize(p,iObj), lVar10 < iVar2; lVar10 = lVar10 + 1) {
      piVar7 = Gia_ObjLutFanins(p,iObj);
      iVar2 = piVar7[lVar10];
      iVar3 = Vec_IntEntry(vDelay,iVar2);
      iVar3 = iVar3 + 10;
      if (Entry < iVar3) {
        local_54 = 1;
        iVar4 = iVar3;
        iVar3 = Entry;
        local_58 = iVar2;
      }
      else {
        iVar4 = Entry;
        if (Entry == iVar3) {
          local_54 = local_54 + 1;
          iVar1 = iVar2;
          iVar3 = iVar8;
          if (fUseTwo == 0) {
            iVar3 = Entry;
          }
        }
        else if (iVar3 < iVar8) {
          iVar3 = iVar8;
        }
      }
      Entry = iVar4;
      iVar8 = iVar3;
    }
  }
  if (local_54 < 1) {
    __assert_fail("nCountMax > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                  ,0x164,
                  "int Gia_ObjComputeEdgeDelay(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  if (Entry < 0xb) goto LAB_00581b7d;
  if (local_54 == 1) {
    uVar5 = Gia_ObjEdgeCount(local_58,vEdge1,vEdge2);
    if (1 < uVar5) goto LAB_00581b7d;
    Gia_ObjEdgeAdd(local_58,iObj,vEdge1,vEdge2);
    iVar1 = local_58;
  }
  else {
    if (local_54 != 2 || fUseTwo == 0) goto LAB_00581b7d;
    uVar5 = Gia_ObjEdgeCount(local_58,vEdge1,vEdge2);
    uVar6 = Gia_ObjEdgeCount(iVar1,vEdge1,vEdge2);
    if ((1 < uVar5) || (1 < uVar6)) goto LAB_00581b7d;
    Gia_ObjEdgeAdd(local_58,iObj,vEdge1,vEdge2);
    Gia_ObjEdgeAdd(iVar1,iObj,vEdge1,vEdge2);
    Gia_ObjEdgeAdd(iObj,local_58,vEdge1,vEdge2);
  }
  Gia_ObjEdgeAdd(iObj,iVar1,vEdge1,vEdge2);
  Entry = Entry + -8;
  if (Entry < iVar8) {
    Entry = iVar8;
  }
LAB_00581b7d:
  Vec_IntWriteEntry(vDelay,iObj,Entry);
  return Entry;
}

Assistant:

int Gia_ObjComputeEdgeDelay( Gia_Man_t * p, int iObj, Vec_Int_t * vDelay, Vec_Int_t * vEdge1, Vec_Int_t * vEdge2, int fUseTwo )
{
    int i, iFan, Delay, Status1, Status2;
    int DelayMax = 0, DelayMax2 = 0, nCountMax = 0;
    int iFanMax1 = -1, iFanMax2 = -1;
    Vec_IntWriteEntry(vEdge1, iObj, 0);
    Vec_IntWriteEntry(vEdge2, iObj, 0);
    if ( Gia_ManHasMapping(p) && Gia_ObjIsLut(p, iObj) )
    {
        assert( Gia_ObjLutSize(p, iObj) <= 4 );
        Gia_LutForEachFanin( p, iObj, iFan, i )
        {
            Delay = Vec_IntEntry( vDelay, iFan ) + 10;
            if ( DelayMax < Delay )
            {
                DelayMax2 = DelayMax;
                DelayMax  = Delay;
                iFanMax1  = iFan;
                nCountMax = 1;
            }
            else if ( DelayMax == Delay )
            {
                iFanMax2  = iFan;
                nCountMax++;
                if ( !fUseTwo )
                    DelayMax2 = DelayMax;
            }
            else
                DelayMax2 = Abc_MaxInt( DelayMax2, Delay );
        }
    }
    else if ( Gia_ObjIsLut2(p, iObj) )
    {
        assert( Gia_ObjLutSize2(p, iObj) <= 4 );
        Gia_LutForEachFanin2( p, iObj, iFan, i )
        {
            Delay = Vec_IntEntry( vDelay, iFan ) + 10;
            if ( DelayMax < Delay )
            {
                DelayMax2 = DelayMax;
                DelayMax  = Delay;
                iFanMax1  = iFan;
                nCountMax = 1;
            }
            else if ( DelayMax == Delay )
            {
                iFanMax2  = iFan;
                nCountMax++;
                if ( !fUseTwo )
                    DelayMax2 = DelayMax;
            }
            else
                DelayMax2 = Abc_MaxInt( DelayMax2, Delay );
        }
    }
    else assert( 0 );
    assert( nCountMax > 0 );
    if ( DelayMax <= 10 )
    {} // skip first level
    else if ( nCountMax == 1 )
    {
        Status1 = Gia_ObjEdgeCount( iFanMax1, vEdge1, vEdge2 );
        if ( Status1 <= 1 )
        {
            Gia_ObjEdgeAdd( iFanMax1, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax1, vEdge1, vEdge2 );
            DelayMax = Abc_MaxInt( DelayMax2, DelayMax - 8 );
            Vec_IntWriteEntry( vDelay, iObj, DelayMax );
            return DelayMax;
        }
    }
    else if ( fUseTwo && nCountMax == 2 )
    {
        Status1 = Gia_ObjEdgeCount( iFanMax1, vEdge1, vEdge2 );
        Status2 = Gia_ObjEdgeCount( iFanMax2, vEdge1, vEdge2 );
        if ( Status1 <= 1 && Status2 <= 1 )
        {
            Gia_ObjEdgeAdd( iFanMax1, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iFanMax2, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax1, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax2, vEdge1, vEdge2 );
            DelayMax = Abc_MaxInt( DelayMax2, DelayMax - 8 );
            Vec_IntWriteEntry( vDelay, iObj, DelayMax );
            return DelayMax;
        }
    }
    Vec_IntWriteEntry( vDelay, iObj, DelayMax );
    return DelayMax;
}